

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1957ff::ReverbState::MixOutAmbiUp
          (ReverbState *this,span<std::array<float,_1024UL>,_18446744073709551615UL> samplesOut,
          size_t counter,size_t offset,size_t todo)

{
  anon_union_4096_2_95c9c352_for_ReverbState_18 *paVar1;
  pointer pfVar2;
  long lVar3;
  float (*pafVar4) [16];
  span<float,_18446744073709551615UL> samples;
  span<float,_18446744073709551615UL> samples_00;
  span<float,_18446744073709551615UL> OutBuffer;
  span<const_float,_18446744073709551615UL> sVar5;
  span<float,_18446744073709551615UL> OutBuffer_00;
  span<const_float,_18446744073709551615UL> sVar6;
  span<const_float,_18446744073709551615UL> Gains;
  span<const_float,_18446744073709551615UL> Gains_00;
  
  paVar1 = &this->field_15;
  pfVar2 = (pointer)((long)this->mMaxUpdate + todo * 4 + 0x20);
  pafVar4 = (this->mEarly).PanGain;
  lVar3 = 0;
  do {
    Gains.mDataEnd = (pointer)((anonymous_namespace)::A2B + lVar3 + 0x10);
    OutBuffer.mDataEnd = pfVar2;
    OutBuffer.mData = (pointer)paVar1;
    Gains.mData = (pointer)((anonymous_namespace)::A2B + lVar3);
    DoMixRow(OutBuffer,Gains,(float *)&this->mEarlySamples,0x100);
    samples.mDataEnd = pfVar2;
    samples.mData = (pointer)paVar1;
    BandSplitterR<float>::processHfScale
              ((BandSplitterR<float> *)
               ((long)&(this->mAmbiSplitter)._M_elems[0]._M_elems[0].mCoeff + lVar3),samples,
               (this->mOrderScales)._M_elems[lVar3 != 0]);
    sVar5.mDataEnd = pfVar2;
    sVar5.mData = (pointer)paVar1;
    (*MixSamples)(sVar5,samplesOut,pafVar4[-4],*pafVar4,counter,offset);
    lVar3 = lVar3 + 0x10;
    pafVar4 = pafVar4 + 1;
  } while (lVar3 != 0x40);
  pafVar4 = (this->mLate).PanGain;
  lVar3 = 0;
  do {
    Gains_00.mDataEnd = (pointer)((anonymous_namespace)::A2B + lVar3 + 0x10);
    OutBuffer_00.mDataEnd = pfVar2;
    OutBuffer_00.mData = (pointer)paVar1;
    Gains_00.mData = (pointer)((anonymous_namespace)::A2B + lVar3);
    DoMixRow(OutBuffer_00,Gains_00,(float *)&this->mLateSamples,0x100);
    samples_00.mDataEnd = pfVar2;
    samples_00.mData = (pointer)paVar1;
    BandSplitterR<float>::processHfScale
              ((BandSplitterR<float> *)
               ((long)&(this->mAmbiSplitter)._M_elems[1]._M_elems[0].mCoeff + lVar3),samples_00,
               (this->mOrderScales)._M_elems[lVar3 != 0]);
    sVar6.mDataEnd = pfVar2;
    sVar6.mData = (pointer)paVar1;
    (*MixSamples)(sVar6,samplesOut,pafVar4[-4],*pafVar4,counter,offset);
    lVar3 = lVar3 + 0x10;
    pafVar4 = pafVar4 + 1;
  } while (lVar3 != 0x40);
  return;
}

Assistant:

void MixOutAmbiUp(const al::span<FloatBufferLine> samplesOut, const size_t counter,
        const size_t offset, const size_t todo)
    {
        ASSUME(todo > 0);

        const al::span<float> tmpspan{al::assume_aligned<16>(mTempLine.data()), todo};
        for(size_t c{0u};c < NUM_LINES;c++)
        {
            DoMixRow(tmpspan, A2B[c], mEarlySamples[0].data(), mEarlySamples[0].size());

            /* Apply scaling to the B-Format's HF response to "upsample" it to
             * higher-order output.
             */
            const float hfscale{(c==0) ? mOrderScales[0] : mOrderScales[1]};
            mAmbiSplitter[0][c].processHfScale(tmpspan, hfscale);

            MixSamples(tmpspan, samplesOut, mEarly.CurrentGain[c], mEarly.PanGain[c], counter,
                offset);
        }
        for(size_t c{0u};c < NUM_LINES;c++)
        {
            DoMixRow(tmpspan, A2B[c], mLateSamples[0].data(), mLateSamples[0].size());

            const float hfscale{(c==0) ? mOrderScales[0] : mOrderScales[1]};
            mAmbiSplitter[1][c].processHfScale(tmpspan, hfscale);

            MixSamples(tmpspan, samplesOut, mLate.CurrentGain[c], mLate.PanGain[c], counter,
                offset);
        }
    }